

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall CompoundStmt::~CompoundStmt(CompoundStmt *this)

{
  bool bVar1;
  reference ppSVar2;
  Stmt *s;
  iterator __end1;
  iterator __begin1;
  vector<Stmt_*,_std::allocator<Stmt_*>_> *__range1;
  CompoundStmt *this_local;
  
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__CompoundStmt_00145c28;
  __end1 = std::vector<Stmt_*,_std::allocator<Stmt_*>_>::begin(&this->stmts);
  s = (Stmt *)std::vector<Stmt_*,_std::allocator<Stmt_*>_>::end(&this->stmts);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Stmt_**,_std::vector<Stmt_*,_std::allocator<Stmt_*>_>_>
                                *)&s);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::__normal_iterator<Stmt_**,_std::vector<Stmt_*,_std::allocator<Stmt_*>_>_>::
              operator*(&__end1);
    if (*ppSVar2 != (Stmt *)0x0) {
      (*((*ppSVar2)->super_Node)._vptr_Node[1])();
    }
    __gnu_cxx::__normal_iterator<Stmt_**,_std::vector<Stmt_*,_std::allocator<Stmt_*>_>_>::operator++
              (&__end1);
  }
  std::vector<Stmt_*,_std::allocator<Stmt_*>_>::~vector(&this->stmts);
  Stmt::~Stmt(&this->super_Stmt);
  return;
}

Assistant:

~CompoundStmt() {
    for (Stmt* s : stmts)
      delete s;
  }